

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O3

int TVMFuncCall(TVMFunctionHandle func,TVMValue_conflict *args,int *arg_type_codes,int num_args,
               TVMValue_conflict *ret_val,int *ret_type_code)

{
  TVMRuntimeEntry *this;
  TVMContext TVar1;
  runtime_error *e;
  int iVar2;
  undefined1 auVar3 [12];
  TVMRetValue rv;
  TVMRetValue local_58;
  string local_48;
  undefined1 *local_28;
  
  local_28 = (undefined1 *)&local_58;
  local_58.super_TVMPODValue_.type_code_ = 4;
  if (func == (TVMFunctionHandle)0x0) {
    __assert_fail("func != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
                  ,0x1be,
                  "int TVMFuncCall(TVMFunctionHandle, TVMValue *, int *, int, TVMValue *, int *)");
  }
  local_48._M_dataplus._M_p = (pointer)args;
  local_48._M_string_length = (size_type)arg_type_codes;
  local_48.field_2._M_allocated_capacity._0_4_ = num_args;
  if (*(long *)((long)func + 0x10) == 0) {
    auVar3 = std::__throw_bad_function_call();
    tvm::runtime::TVMRetValue::Clear(&local_58);
    if (auVar3._8_4_ != 1) {
      _Unwind_Resume(auVar3._0_8_);
    }
    e = (runtime_error *)__cxa_begin_catch(auVar3._0_8_);
    TVMAPIHandleException(e);
    __cxa_end_catch();
    iVar2 = -1;
  }
  else {
    local_28 = (undefined1 *)&local_58;
    (**(code **)((long)func + 0x18))(func,&local_48,&local_28);
    if (((uint)local_58.super_TVMPODValue_.type_code_ < 0xd) &&
       ((0x1820U >> (local_58.super_TVMPODValue_.type_code_ & 0x1fU) & 1) != 0)) {
      this = dmlc::ThreadLocalStore<TVMRuntimeEntry>::Get();
      if (local_58.super_TVMPODValue_.type_code_ == 5) {
        tvm::runtime::TVMRetValue::operator_cast_to_string(&local_48,&local_58);
        std::__cxx11::string::operator=((string *)this,(string *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT44(local_48.field_2._M_allocated_capacity._4_4_,
                                   local_48.field_2._M_allocated_capacity._0_4_) + 1);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)this);
      }
      TVar1 = (TVMContext)(this->ret_str)._M_dataplus._M_p;
      iVar2 = 0xb;
      if (local_58.super_TVMPODValue_.type_code_ == 0xc) {
        (this->ret_bytes).data = (char *)TVar1;
        TVar1 = (TVMContext)&this->ret_bytes;
        (this->ret_bytes).size = (this->ret_str)._M_string_length;
        iVar2 = 0xc;
      }
      *ret_type_code = iVar2;
      ret_val->v_ctx = TVar1;
    }
    else {
      tvm::runtime::TVMRetValue::MoveToCHost(&local_58,ret_val,ret_type_code);
    }
    tvm::runtime::TVMRetValue::Clear(&local_58);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int TVMFuncCall(TVMFunctionHandle func,
                TVMValue *args,
                int *arg_type_codes,
                int num_args,
                TVMValue *ret_val,
                int *ret_type_code) {
  API_BEGIN();
  TVMRetValue rv;
#ifdef DEBUG_DLR
  std::cout << "[TVMFuncCall]" << std::endl;
#endif
  assert(func != 0);

  (*static_cast<const PackedFunc *>(func)).CallPacked(TVMArgs(args, arg_type_codes, num_args), &rv);
  // handle return string.
  if (rv.type_code() == kStr ||
      rv.type_code() == kTVMType ||
      rv.type_code() == kBytes) {
    TVMRuntimeEntry *e = TVMAPIRuntimeStore::Get();
    if (rv.type_code() != kTVMType) {
      e->ret_str = *rv.ptr<std::string>();
    } else {
      e->ret_str = rv.operator std::string();
    }
    if (rv.type_code() == kBytes) {
      e->ret_bytes.data = e->ret_str.c_str();
      e->ret_bytes.size = e->ret_str.length();
      *ret_type_code = kBytes;
      ret_val->v_handle = &(e->ret_bytes);
    } else {
      *ret_type_code = kStr;
      ret_val->v_str = e->ret_str.c_str();
    }
  } else {
    rv.MoveToCHost(ret_val, ret_type_code);
  }
  API_END();
}